

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_thread.c
# Opt level: O0

void change_state(AVxWorker *worker,AVxWorkerStatus new_status)

{
  int in_ESI;
  long *in_RDI;
  
  if (*in_RDI != 0) {
    pthread_mutex_lock((pthread_mutex_t *)*in_RDI);
    if ((int)in_RDI[1] != 0) {
      while ((int)in_RDI[1] != 1) {
        pthread_cond_wait((pthread_cond_t *)(*in_RDI + 0x28),(pthread_mutex_t *)*in_RDI);
      }
      if (in_ESI != 1) {
        *(int *)(in_RDI + 1) = in_ESI;
        pthread_cond_signal((pthread_cond_t *)(*in_RDI + 0x28));
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)*in_RDI);
  }
  return;
}

Assistant:

static void change_state(AVxWorker *const worker, AVxWorkerStatus new_status) {
  // No-op when attempting to change state on a thread that didn't come up.
  // Checking status_ without acquiring the lock first would result in a data
  // race.
  if (worker->impl_ == NULL) return;

  pthread_mutex_lock(&worker->impl_->mutex_);
  if (worker->status_ >= AVX_WORKER_STATUS_OK) {
    // wait for the worker to finish
    while (worker->status_ != AVX_WORKER_STATUS_OK) {
      pthread_cond_wait(&worker->impl_->condition_, &worker->impl_->mutex_);
    }
    // assign new status and release the working thread if needed
    if (new_status != AVX_WORKER_STATUS_OK) {
      worker->status_ = new_status;
      pthread_cond_signal(&worker->impl_->condition_);
    }
  }
  pthread_mutex_unlock(&worker->impl_->mutex_);
}